

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

wchar_t archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  wVar5 = L'\0';
  if (length != 0) {
    plVar3 = (long *)f->data;
    if (*plVar3 == 0) {
      bVar1 = *buff;
      buff = (void *)((long)buff + 1);
      *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
      *plVar3 = 1;
      length = length - 1;
    }
LAB_002125a7:
    do {
      while( true ) {
        bVar11 = length == 0;
        length = length - 1;
        if (bVar11) {
          return L'\0';
        }
        bVar1 = *buff;
        buff = (void *)((long)buff + 1);
        *plVar3 = *plVar3 + 1;
        wVar5 = *(wchar_t *)((long)plVar3 + 0x65164);
        iVar4 = (uint)bVar1 * 0x10000 + wVar5;
        *(int *)(plVar3 + 0xca2d) = iVar4;
        uVar10 = wVar5 ^ (uint)bVar1 << 8;
        iVar6 = *(int *)((long)plVar3 + (long)(int)uVar10 * 4 + 0x24);
        if (iVar6 != iVar4) break;
        *(uint *)((long)plVar3 + 0x65164) =
             (uint)*(ushort *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648);
      }
      if (-1 < iVar6) {
        iVar6 = uVar10 - 0x10d89;
        if ((uint)bVar1 << 8 == wVar5) {
          iVar6 = -1;
        }
        do {
          uVar8 = uVar10 + iVar6;
          uVar10 = uVar10 + 0x10d89 + iVar6;
          if (-1 < (int)uVar8) {
            uVar10 = uVar8;
          }
          iVar2 = *(int *)((long)plVar3 + 0x24 + (long)(int)uVar10 * 4);
          if (iVar2 == iVar4) {
            *(uint *)((long)plVar3 + 0x65164) =
                 (uint)*(ushort *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648);
            goto LAB_002125a7;
          }
        } while (-1 < iVar2);
      }
      wVar5 = output_code(f,wVar5);
      if (wVar5 != L'\0') {
        return wVar5;
      }
      *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
      iVar6 = *(int *)((long)plVar3 + 0x6515c);
      if (iVar6 < (int)plVar3[4]) {
        *(int *)((long)plVar3 + 0x6515c) = iVar6 + 1;
        *(short *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648) = (short)iVar6;
        *(int *)((long)plVar3 + (long)(int)uVar10 * 4 + 0x24) = (int)plVar3[0xca2d];
        goto LAB_002125a7;
      }
      lVar7 = *plVar3;
      if (lVar7 < plVar3[2]) goto LAB_002125a7;
      plVar3[2] = lVar7 + 10000;
      lVar9 = plVar3[1];
      if (lVar7 < 0x800000) {
        if (lVar9 != 0) {
          lVar7 = lVar7 << 8;
          goto LAB_002126c7;
        }
LAB_002126d1:
        iVar6 = 0x7fffffff;
      }
      else {
        iVar6 = (int)(lVar9 / 0x100);
        if (iVar6 == 0) goto LAB_002126d1;
        lVar9 = (long)iVar6;
LAB_002126c7:
        iVar6 = (int)(lVar7 / lVar9);
      }
      if ((int)plVar3[0xca2c] < iVar6) {
        *(int *)(plVar3 + 0xca2c) = iVar6;
        goto LAB_002125a7;
      }
      *(undefined4 *)(plVar3 + 0xca2c) = 0;
      memset((void *)((long)plVar3 + 0x24),0xff,0x43624);
      *(undefined4 *)((long)plVar3 + 0x6515c) = 0x101;
      wVar5 = output_code(f,L'Ā');
    } while (wVar5 == L'\0');
  }
  return wVar5;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}